

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O3

int Msat_OrderVarSelect(Msat_Order_t *p)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Msat_IntVec_t *p_00;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  timespec ts;
  long local_48;
  timespec local_40;
  
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    local_48 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p_00 = p->vHeap;
  do {
    if (p_00->nSize == 1) {
      return -3;
    }
    iVar6 = p_00->pArray[1];
    iVar7 = Msat_IntVecPop(p_00);
    p_00 = p->vHeap;
    piVar3 = p_00->pArray;
    piVar3[1] = iVar7;
    piVar4 = p->vIndex->pArray;
    piVar4[iVar7] = 1;
    piVar4[iVar6] = 0;
    iVar7 = p_00->nSize;
    if (1 < iVar7) {
      iVar2 = piVar3[1];
      if (iVar7 == 2) {
        uVar10 = 1;
      }
      else {
        pdVar5 = p->pSat->pdActivity;
        dVar1 = pdVar5[iVar2];
        uVar11 = 2;
        uVar10 = 1;
        do {
          uVar9 = uVar11 | 1;
          if ((int)uVar9 < iVar7) {
            iVar12 = piVar3[(int)uVar9];
            lVar8 = (long)piVar3[(int)uVar11];
            dVar14 = pdVar5[lVar8];
            lVar13 = (long)iVar12;
            dVar15 = pdVar5[iVar12];
            iVar7 = piVar3[(int)uVar11];
            if (pdVar5[iVar12] <= dVar14) goto LAB_00937b42;
          }
          else {
            lVar8 = (long)piVar3[(int)uVar11];
            dVar14 = pdVar5[lVar8];
            iVar7 = piVar3[(int)uVar11];
LAB_00937b42:
            iVar12 = iVar7;
            lVar13 = lVar8;
            dVar15 = dVar14;
            uVar9 = uVar11;
          }
          if (dVar15 <= dVar1) break;
          piVar3[(int)uVar10] = iVar12;
          piVar4[lVar13] = uVar10;
          uVar11 = uVar9 * 2;
          iVar7 = p_00->nSize;
          uVar10 = uVar9;
        } while ((int)uVar11 < iVar7);
      }
      piVar3[(int)uVar10] = iVar2;
      piVar4[iVar2] = uVar10;
    }
    if (p->pSat->pAssigns[iVar6] == -1) {
      iVar7 = clock_gettime(3,&local_40);
      if (iVar7 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      timeSelect = timeSelect + lVar8 + local_48;
      return iVar6;
    }
  } while( true );
}

Assistant:

int Msat_OrderVarSelect( Msat_Order_t * p )
{
    // Activity based decision:
//    while (!heap.empty()){
//        Var next = heap.getmin();
//        if (toLbool(assigns[next]) == l_Undef)
//            return next;
//    }
//    return var_Undef;

    int Var;
    abctime clk = Abc_Clock();

    while ( !HEMPTY(p) )
    {
        Var = Msat_HeapGetTop(p);
        if ( (p)->pSat->pAssigns[Var] == MSAT_VAR_UNASSIGNED )
        {
//assert( Msat_OrderCheck(p) );
timeSelect += Abc_Clock() - clk;
            return Var;
        }
    }
    return MSAT_ORDER_UNKNOWN;
}